

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node_iterator * __thiscall pugi::xml_node_iterator::operator--(xml_node_iterator *this)

{
  xml_node_struct *local_18;
  xml_node_iterator *this_local;
  
  if ((this->_wrap)._root == (xml_node_struct *)0x0) {
    local_18 = (xml_node_struct *)xml_node::last_child(&this->_parent);
  }
  else {
    local_18 = (xml_node_struct *)xml_node::previous_sibling(&this->_wrap);
  }
  (this->_wrap)._root = local_18;
  return this;
}

Assistant:

PUGI__FN xml_node_iterator& xml_node_iterator::operator--()
	{
		_wrap = _wrap._root ? _wrap.previous_sibling() : _parent.last_child();
		return *this;
	}